

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

bool ImNodes::BeginNode(void *node_id,ImVec2 *pos,bool *selected)

{
  float fVar1;
  undefined8 uVar2;
  long lVar3;
  ImVec2 IVar4;
  float *pfVar5;
  ImGuiStyle *pIVar6;
  ImDrawList *this;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 local_50;
  undefined1 local_48 [24];
  
  if (gCanvas == (float *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x179,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (node_id == (void *)0x0) {
    __assert_fail("node_id != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x17a,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (pos == (ImVec2 *)0x0) {
    __assert_fail("pos != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x17b,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (selected != (bool *)0x0) {
    pIVar6 = ImGui::GetStyle();
    this = ImGui::GetWindowDrawList();
    pfVar5 = gCanvas;
    lVar3 = *(long *)(gCanvas + 0x26);
    *(void **)(lVar3 + 0x10) = node_id;
    *(ImVec2 **)(lVar3 + 0x18) = pos;
    *(bool **)(lVar3 + 0x20) = selected;
    ImDrawList::ChannelsSplit(this,2);
    if (*(void **)(lVar3 + 0x38) == node_id) {
      IVar4 = ImGui::GetWindowPos();
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_4_ = IVar4.x;
      local_48._4_4_ = IVar4.y;
      local_48._12_4_ = extraout_XMM0_Dd;
      IVar4 = ImGui::GetWindowSize();
      local_50.x = (pIVar6->WindowPadding).x + IVar4.x + (float)local_48._0_4_;
      local_50.y = (pIVar6->WindowPadding).y + IVar4.y + (float)local_48._4_4_;
    }
    else {
      IVar4 = ImGui::GetWindowPos();
      fVar1 = *pfVar5;
      uVar2 = *(undefined8 *)(pfVar5 + 1);
      local_50.y = (float)((ulong)uVar2 >> 0x20) + fVar1 * (*pos).y + IVar4.y;
      local_50.x = (float)uVar2 + fVar1 * (*pos).x + IVar4.x;
    }
    ImGui::SetCursorScreenPos(&local_50);
    ImGui::PushID(node_id);
    ImGui::BeginGroup();
    ImDrawList::ChannelsSetCurrent(this,1);
    return true;
  }
  __assert_fail("selected != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x17c,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
}

Assistant:

bool BeginNode(void* node_id, ImVec2* pos, bool* selected)
{
    assert(gCanvas != nullptr);
    assert(node_id != nullptr);
    assert(pos != nullptr);
    assert(selected != nullptr);
    const ImGuiStyle& style = ImGui::GetStyle();
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    impl->node.id = node_id;
    impl->node.pos = pos;
    impl->node.selected = selected;

    // 0 - node rect, curves
    // 1 - node content
    draw_list->ChannelsSplit(2);

    if (node_id == impl->auto_position_node_id)
    {
        // Somewhere out of view so that we dont see node flicker when it will be repositioned
        ImGui::SetCursorScreenPos(ImGui::GetWindowPos() + ImGui::GetWindowSize() + style.WindowPadding);
    }
    else
    {
        // Top-let corner of the node
        ImGui::SetCursorScreenPos(ImGui::GetWindowPos() + (*pos) * canvas->zoom + canvas->offset);
    }

    ImGui::PushID(node_id);

    ImGui::BeginGroup();    // Slots and content group
    draw_list->ChannelsSetCurrent(1);

    return true;
}